

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (Printer *p,FieldDescriptor *field,Options *options,bool for_parse,string_view params
               ,string_view strict_function,string_view verify_function)

{
  char cVar1;
  FileOptions_OptimizeMode FVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string_view params_local;
  string local_2d0;
  string local_2b0;
  string local_290;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Sub local_258 [3];
  
  params_local._M_str = params._M_str;
  params_local._M_len = params._M_len;
  if (field[2] != (FieldDescriptor)0x9) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"params",&local_2e1);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (local_258,&local_290,&params_local);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Strict",&local_2e2);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (local_258 + 1,&local_2b0,&strict_function);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Verify",&local_2e3);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (local_258 + 2,&local_2d0,&verify_function);
  vars.len_ = 3;
  vars.ptr_ = local_258;
  io::Printer::WithVars(&v,p,vars);
  lVar5 = 0x170;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_258[0].key_._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != -0xb8);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),options);
  cVar1 = google::protobuf::internal::cpp::GetUtf8CheckMode
                    (field,FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME);
  if (cVar1 == '\0') {
    lVar5 = (ulong)for_parse + 0x81;
    pcVar3 = 
    "\n          DO_($pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::PARSE, \"$pkg.Msg.field$\"));\n        "
    ;
    pcVar4 = 
    "\n          $pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::SERIALIZE, \"$pkg.Msg.field$\");\n        "
    ;
  }
  else {
    if (cVar1 != '\x01') goto LAB_001b1e1b;
    lVar5 = (ulong)!for_parse * 4 + 0x8c;
    pcVar3 = 
    "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,\n                                      \"$pkg.Msg.field$\");\n        "
    ;
    pcVar4 = 
    "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,\n                                      \"$pkg.Msg.field$\");\n        "
    ;
  }
  if (for_parse) {
    pcVar4 = pcVar3;
  }
  io::Printer::Emit(p,lVar5,pcVar4);
LAB_001b1e1b:
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

static void GenerateUtf8CheckCode(io::Printer* p, const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  absl::string_view params,
                                  absl::string_view strict_function,
                                  absl::string_view verify_function) {
  if (field->type() != FieldDescriptor::TYPE_STRING) return;

  auto v = p->WithVars({
      {"params", params},
      {"Strict", strict_function},
      {"Verify", verify_function},
  });

  bool is_lite =
      GetOptimizeFor(field->file(), options) == FileOptions::LITE_RUNTIME;
  switch (internal::cpp::GetUtf8CheckMode(field, is_lite)) {
    case internal::cpp::Utf8CheckMode::kStrict:
      if (for_parse) {
        p->Emit(R"cc(
          DO_($pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::PARSE, "$pkg.Msg.field$"));
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::SERIALIZE, "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kVerify:
      if (for_parse) {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,
                                      "$pkg.Msg.field$");
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,
                                      "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kNone:
      break;
  }
}